

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RandJoinClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RandJoinClauseSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,ParenthesizedExpressionSyntax **args_2)

{
  ParenthesizedExpressionSyntax *pPVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  RandJoinClauseSyntax *pRVar12;
  
  pRVar12 = (RandJoinClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RandJoinClauseSyntax *)this->endPtr < pRVar12 + 1) {
    pRVar12 = (RandJoinClauseSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pRVar12 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar2 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar3 = args_1->info;
  pPVar1 = *args_2;
  (pRVar12->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pRVar12->super_SyntaxNode).kind = RandJoinClause;
  (pRVar12->rand).kind = TVar4;
  (pRVar12->rand).field_0x2 = uVar5;
  (pRVar12->rand).numFlags = (NumericTokenFlags)NVar6.raw;
  (pRVar12->rand).rawLen = uVar7;
  (pRVar12->rand).info = pIVar2;
  (pRVar12->join).kind = TVar8;
  (pRVar12->join).field_0x2 = uVar9;
  (pRVar12->join).numFlags = (NumericTokenFlags)NVar10.raw;
  (pRVar12->join).rawLen = uVar11;
  (pRVar12->join).info = pIVar3;
  pRVar12->expr = pPVar1;
  if (pPVar1 != (ParenthesizedExpressionSyntax *)0x0) {
    (pPVar1->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
         &pRVar12->super_SyntaxNode;
  }
  return pRVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }